

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.cpp
# Opt level: O0

void __thiscall
gmlc::networking::SocketFactory::load_json_config_file(SocketFactory *this,string *file)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_RSI;
  stringstream strbuf;
  ifstream ifs;
  stringstream local_3a0 [16];
  undefined1 local_390 [8];
  string *in_stack_fffffffffffffc78;
  SocketFactory *in_stack_fffffffffffffc80;
  undefined1 local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  std::__cxx11::stringstream::stringstream(local_3a0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::ifstream::rdbuf();
  std::ostream::operator<<(local_390,(streambuf *)this_00);
  std::__cxx11::stringstream::str();
  parse_json_config(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void SocketFactory::load_json_config_file(std::string file)
{
    std::ifstream ifs(file);
    std::stringstream strbuf;
    strbuf << ifs.rdbuf();
    parse_json_config(strbuf.str());
}